

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha256_datasrc(char *buf,CVmDataSource *src,unsigned_long len)

{
  int iVar1;
  ulong uVar2;
  uchar *hval;
  long lVar3;
  sha256_ctx ctx;
  uchar hash [32];
  sha256_ctx local_4a0;
  uchar local_438 [1032];
  
  local_4a0.count[0] = 0;
  local_4a0.count[1] = 0;
  local_4a0.hash[0] = 0x6a09e667;
  local_4a0.hash[1] = 0xbb67ae85;
  local_4a0.hash[2] = 0x3c6ef372;
  local_4a0.hash[3] = 0xa54ff53a;
  local_4a0.hash[4] = 0x510e527f;
  local_4a0.hash[5] = 0x9b05688c;
  local_4a0.hash[6] = 0x1f83d9ab;
  local_4a0.hash[7] = 0x5be0cd19;
  hval = local_438;
  for (; len != 0; len = len - (long)iVar1) {
    uVar2 = 0x400;
    if (len < 0x400) {
      uVar2 = len;
    }
    iVar1 = (*src->_vptr_CVmDataSource[3])(src,hval,uVar2);
    if (iVar1 == 0) break;
    sha256_hash(hval,(long)iVar1,&local_4a0);
  }
  sha256_end(hval,&local_4a0);
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 2) {
    byte_to_xdigits(buf + lVar3,*hval);
    hval = hval + 1;
  }
  buf[0x40] = '\0';
  return;
}

Assistant:

void sha256_datasrc(char *buf, CVmDataSource *src, unsigned long len)
{
    /* set up the hash accumulator */
    sha256_ctx ctx;
    sha256_begin(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len != 0)
    {
        /* get a chunk up to one buffer-full, or the total remaining */
        unsigned char buf[1024];
        size_t cur = (len > sizeof(buf) ? sizeof(buf) : (size_t)len);

        /* read the chunk */
        if (cur != 0)
            cur = src->readc(buf, cur);

        /* if there's nothing left, we're done */
        if (cur == 0)
            break;

        /* feed this chunk into the hash */
        sha256_hash(buf, cur, &ctx);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 32;
    unsigned char hash[HASH_BYTES];
    sha256_end(hash, &ctx);

    /* convert the binary hash to printable hex digits */
    char *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* null-terminate the string */
    *bufp = '\0';
}